

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

Regexp * re2::Regexp::Parse(StringPiece *s,ParseFlags global_flags,RegexpStatus *status)

{
  byte bVar1;
  const_pointer pcVar2;
  ParseFlags parse_flags;
  ParseStatus PVar3;
  int iVar4;
  string *utf;
  Regexp *pRVar5;
  CharClassBuilder *pCVar6;
  uint8_t *puVar7;
  UGroup *g;
  RegexpStatus *pRVar8;
  size_type sVar9;
  uint8_t uVar10;
  Regexp *pRVar11;
  RegexpOp op;
  size_type sVar12;
  bool bVar13;
  StringPiece local_d8;
  Rune r;
  size_type sStack_c0;
  Regexp *local_b0;
  int hi;
  int lo;
  RegexpStatus *local_a0;
  ParseState ps;
  StringPiece local_68;
  RegexpStatus xstatus;
  
  xstatus.code_ = kRegexpSuccess;
  xstatus.tmp_ = (string *)0x0;
  pRVar8 = status;
  if (status == (RegexpStatus *)0x0) {
    pRVar8 = &xstatus;
  }
  xstatus.error_arg_.data_ = (const_pointer)0x0;
  xstatus.error_arg_.size_ = 0;
  ps.whole_regexp_.data_ = s->data_;
  ps.whole_regexp_.size_ = s->size_;
  ps.stacktop_ = (Regexp *)0x0;
  ps.ncap_ = 0;
  bVar13 = (global_flags & Latin1) == NoParseFlags;
  ps.rune_max_ = 0xff;
  if (bVar13) {
    ps.rune_max_ = 0x10ffff;
  }
  local_d8.data_ = s->data_;
  local_d8.size_ = s->size_;
  ps.flags_ = global_flags;
  ps.status_ = pRVar8;
  if (!bVar13) {
    utf = (string *)operator_new(0x20);
    (utf->_M_dataplus)._M_p = (pointer)&utf->field_2;
    utf->_M_string_length = 0;
    (utf->field_2)._M_local_buf[0] = '\0';
    ConvertLatin1ToUTF8(&local_d8,utf);
    RegexpStatus::set_tmp(pRVar8,utf);
    local_d8.data_ = (utf->_M_dataplus)._M_p;
    local_d8.size_ = utf->_M_string_length;
  }
  if ((global_flags & Literal) == NoParseFlags) {
    local_b0 = (Regexp *)0x0;
    local_a0 = status;
LAB_001b3c80:
    sVar12 = 0;
LAB_001b3c83:
    pRVar5 = (Regexp *)0x0;
LAB_001b3c86:
    parse_flags = ps.flags_;
    pcVar2 = local_d8.data_;
    if (local_d8.size_ == 0) {
      local_b0 = ParseState::DoFinish(&ps);
      goto LAB_001b4309;
    }
    uVar10 = *(uint8_t *)local_d8.data_;
    op = kRegexpStar;
    switch(uVar10) {
    case '$':
      ParseState::PushDollar(&ps);
      break;
    case '%':
    case '&':
    case '\'':
    case ',':
    case '-':
switchD_001b3cb4_caseD_25:
      iVar4 = StringPieceToRune(&r,&local_d8,pRVar8);
      if (iVar4 < 0) goto LAB_001b4300;
      ParseState::PushLiteral(&ps,r);
      goto LAB_001b3c80;
    case '(':
      if ((local_d8.size_ != 1 && (ps.flags_ >> 9 & 1) != 0) &&
         (*(uint8_t *)((long)local_d8.data_ + 1) == '?')) {
        bVar13 = ParseState::ParsePerlFlags(&ps,&local_d8);
        sVar12 = 0;
        pRVar5 = (Regexp *)0x0;
        if (!bVar13) goto LAB_001b4309;
        goto LAB_001b3c86;
      }
      if ((ps.flags_ >> 0xc & 1) == 0) {
        _r = (Regexp *)0x0;
        sStack_c0 = 0;
        ParseState::DoLeftParen(&ps,(StringPiece *)&r);
      }
      else {
        ParseState::DoLeftParenNoCapture(&ps);
      }
      break;
    case ')':
      bVar13 = ParseState::DoRightParen(&ps);
      if (!bVar13) goto LAB_001b4309;
      break;
    case '*':
      goto switchD_001b3cb4_caseD_2a;
    case '+':
      op = kRegexpPlus;
switchD_001b3cb4_caseD_2a:
      _r = (Regexp *)local_d8.data_;
      sStack_c0 = local_d8.size_;
      pRVar11 = (Regexp *)((long)local_d8.data_ + 1);
      sVar9 = local_d8.size_ - 1;
      if ((ps.flags_ & PerlX) == NoParseFlags) {
        bVar13 = false;
        local_d8.data_ = (const_pointer)pRVar11;
        local_d8.size_ = sVar9;
      }
      else {
        if ((sVar9 == 0) || (*(uint8_t *)pRVar11 != '?')) {
          bVar13 = false;
          local_d8.size_ = sVar9;
        }
        else {
          pRVar11 = (Regexp *)((long)local_d8.data_ + 2);
          bVar13 = true;
          local_d8.size_ = local_d8.size_ - 2;
        }
        local_d8.data_ = (const_pointer)pRVar11;
        if (sVar12 != 0) {
          pRVar8->code_ = kRegexpRepeatOp;
          pRVar8 = &xstatus;
          if (local_a0 != (RegexpStatus *)0x0) {
            pRVar8 = local_a0;
          }
          (pRVar8->error_arg_).data_ = (const_pointer)pRVar5;
          (pRVar8->error_arg_).size_ = (long)pRVar11 - (long)pRVar5;
          goto LAB_001b4300;
        }
      }
      sVar12 = (long)local_d8.data_ - (long)pcVar2;
      sStack_c0 = sVar12;
      bVar13 = ParseState::PushRepeatOp(&ps,op,(StringPiece *)&r,bVar13);
      pRVar5 = (Regexp *)pcVar2;
joined_r0x001b40c3:
      if (!bVar13) goto LAB_001b4300;
      goto LAB_001b3c86;
    case '.':
      ParseState::PushDot(&ps);
      break;
    default:
      if (uVar10 == '?') {
        op = kRegexpQuest;
        goto switchD_001b3cb4_caseD_2a;
      }
      if (uVar10 == '[') {
        bVar13 = ParseState::ParseCharClass(&ps,&local_d8,(Regexp **)&r,pRVar8);
        if (!bVar13) goto LAB_001b4300;
        ParseState::PushRegexp(&ps,_r);
        goto LAB_001b3c80;
      }
      if (uVar10 != '\\') {
        if (uVar10 == '^') {
          ParseState::PushCarat(&ps);
          break;
        }
        if (uVar10 != '{') {
          if (uVar10 != '|') goto switchD_001b3cb4_caseD_25;
          ParseState::DoVerticalBar(&ps);
          break;
        }
        local_68.data_ = local_d8.data_;
        local_68.size_ = local_d8.size_;
        _r = (Regexp *)local_d8.data_;
        sStack_c0 = local_d8.size_;
        if ((local_d8.size_ != 0) && (*(uint8_t *)local_d8.data_ == '{')) {
          _r = (Regexp *)((long)local_d8.data_ + 1);
          sStack_c0 = local_d8.size_ - 1;
          bVar13 = ParseInteger((StringPiece *)&r,&lo);
          if ((!bVar13) || (sStack_c0 == 0)) goto LAB_001b3fb1;
          uVar10 = _r->op_;
          iVar4 = lo;
          if (uVar10 == ',') {
            _r = (Regexp *)&_r->simple_;
            sStack_c0 = sStack_c0 - 1;
            if (sStack_c0 == 0) goto LAB_001b3fb1;
            uVar10 = '}';
            iVar4 = -1;
            if (*(uint8_t *)_r != '}') {
              bVar13 = ParseInteger((StringPiece *)&r,&hi);
              if (sStack_c0 == 0 || !bVar13) goto LAB_001b3fb1;
              uVar10 = _r->op_;
              iVar4 = hi;
            }
          }
          hi = iVar4;
          pcVar2 = local_68.data_;
          if (uVar10 != '}') goto LAB_001b3fb1;
          puVar7 = &_r->simple_;
          sVar9 = sStack_c0 - 1;
          local_d8.data_ = (const_pointer)puVar7;
          local_d8.size_ = sVar9;
          if ((ps.flags_ & PerlX) == NoParseFlags) {
            bVar13 = false;
          }
          else {
            if ((sVar9 == 0) || (*puVar7 != '?')) {
              bVar13 = false;
            }
            else {
              bVar13 = true;
              local_d8.data_ = (const_pointer)&_r->parse_flags_;
              local_d8.size_ = sStack_c0 - 2;
            }
            if (sVar12 != 0) {
              pRVar8->code_ = kRegexpRepeatOp;
              pRVar8 = &xstatus;
              if (local_a0 != (RegexpStatus *)0x0) {
                pRVar8 = local_a0;
              }
              (pRVar8->error_arg_).data_ = (const_pointer)pRVar5;
              (pRVar8->error_arg_).size_ = (long)local_d8.data_ - (long)pRVar5;
              _r = (Regexp *)puVar7;
              sStack_c0 = sVar9;
              goto LAB_001b4300;
            }
          }
          sVar12 = (long)local_d8.data_ - (long)local_68.data_;
          _r = (Regexp *)puVar7;
          sStack_c0 = sVar9;
          local_68.size_ = sVar12;
          bVar13 = ParseState::PushRepetition(&ps,lo,hi,&local_68,bVar13);
          pRVar5 = (Regexp *)pcVar2;
          goto joined_r0x001b40c3;
        }
LAB_001b3fb1:
        ParseState::PushLiteral(&ps,0x7b);
        local_d8.data_ = (const_pointer)((long)local_d8.data_ + 1);
        local_d8.size_ = local_d8.size_ - 1;
        sVar12 = 0;
        pRVar5 = (Regexp *)0x0;
        goto LAB_001b3c86;
      }
      if ((ps.flags_ >> 8 & 1) == 0) {
LAB_001b3e04:
        if ((ps.flags_ >> 9 & 1) == 0) {
          if (local_d8.size_ == 1) goto LAB_001b3fdb;
          bVar1 = *(uint8_t *)((long)local_d8.data_ + 1);
LAB_001b3e1c:
          if ((bVar1 | 0x20) != 0x70) goto LAB_001b3fdb;
          pRVar5 = (Regexp *)operator_new(0x28);
          Regexp(pRVar5,kRegexpCharClass,
                 parse_flags &
                 (WasDollar|NeverCapture|NeverNL|UnicodeGroups|PerlX|PerlB|PerlClasses|NonGreedy|
                  Latin1|OneLine|MatchNL|Literal));
          pCVar6 = (CharClassBuilder *)operator_new(0x40);
          CharClassBuilder::CharClassBuilder(pCVar6);
          (pRVar5->field_7).field_3.ccb_ = pCVar6;
          PVar3 = ParseUnicodeGroup(&local_d8,parse_flags,pCVar6,pRVar8);
          if (PVar3 == kParseOk) goto LAB_001b4052;
          if (PVar3 != kParseNothing) {
            if (PVar3 != kParseError) goto LAB_001b3fdb;
            Decref(pRVar5);
            goto LAB_001b4300;
          }
          Decref(pRVar5);
          goto LAB_001b3fdb;
        }
        if (local_d8.size_ == 1) goto LAB_001b3fdb;
        bVar1 = *(uint8_t *)((long)local_d8.data_ + 1);
        if (bVar1 == 0x7a) {
          ParseState::PushSimpleOp(&ps,kRegexpEndText);
        }
        else {
          if (bVar1 != 0x43) {
            if (bVar1 != 0x51) {
              if (bVar1 != 0x41) goto LAB_001b3e1c;
              ParseState::PushSimpleOp(&ps,kRegexpBeginText);
              goto LAB_001b4237;
            }
            local_d8.data_ = (const_pointer)((long)local_d8.data_ + 2);
            local_d8.size_ = local_d8.size_ - 2;
            do {
              if (local_d8.size_ != 1) {
                sVar12 = local_d8.size_;
                if (local_d8.size_ == 0) goto LAB_001b3c83;
                if ((*(uint8_t *)local_d8.data_ == '\\') &&
                   (*(uint8_t *)((long)local_d8.data_ + 1) == 'E')) {
                  local_d8.data_ = (const_pointer)((long)local_d8.data_ + 2);
                  local_d8.size_ = local_d8.size_ - 2;
                  goto LAB_001b3c80;
                }
              }
              iVar4 = StringPieceToRune(&r,&local_d8,pRVar8);
              if (iVar4 < 0) goto LAB_001b4300;
              ParseState::PushLiteral(&ps,r);
            } while( true );
          }
          ParseState::PushSimpleOp(&ps,kRegexpAnyByte);
        }
      }
      else {
        if (local_d8.size_ == 1) {
LAB_001b3fdb:
          g = MaybeParsePerlCCEscape(&local_d8,parse_flags);
          if (g == (UGroup *)0x0) {
            bVar13 = ParseEscape(&local_d8,&r,pRVar8,ps.rune_max_);
            if (!bVar13) goto LAB_001b4300;
            ParseState::PushLiteral(&ps,r);
            goto LAB_001b3c80;
          }
          pRVar5 = (Regexp *)operator_new(0x28);
          Regexp(pRVar5,kRegexpCharClass,
                 parse_flags &
                 (WasDollar|NeverCapture|NeverNL|UnicodeGroups|PerlX|PerlB|PerlClasses|NonGreedy|
                  Latin1|OneLine|MatchNL|Literal));
          pCVar6 = (CharClassBuilder *)operator_new(0x40);
          CharClassBuilder::CharClassBuilder(pCVar6);
          (pRVar5->field_7).field_3.ccb_ = pCVar6;
          AddUGroup(pCVar6,g,g->sign,parse_flags);
          ParseState::PushRegexp(&ps,pRVar5);
          sVar12 = 0;
          pRVar5 = (Regexp *)0x0;
          goto LAB_001b3c86;
        }
        if ((*(uint8_t *)((long)local_d8.data_ + 1) | 0x20) != 0x62) goto LAB_001b3e04;
        ParseState::PushWordBoundary(&ps,*(uint8_t *)((long)local_d8.data_ + 1) == 0x62);
      }
LAB_001b4237:
      local_d8.data_ = (const_pointer)((long)local_d8.data_ + 2);
      local_d8.size_ = local_d8.size_ - 2;
      goto LAB_001b3c80;
    }
    local_d8.data_ = (const_pointer)((long)local_d8.data_ + 1);
    local_d8.size_ = local_d8.size_ - 1;
    goto LAB_001b3c80;
  }
  while (local_d8.size_ != 0) {
    iVar4 = StringPieceToRune(&r,&local_d8,pRVar8);
    if (iVar4 < 0) goto LAB_001b4300;
    ParseState::PushLiteral(&ps,r);
  }
  local_b0 = ParseState::DoFinish(&ps);
LAB_001b4309:
  ParseState::~ParseState(&ps);
  RegexpStatus::~RegexpStatus(&xstatus);
  return local_b0;
LAB_001b4052:
  ParseState::PushRegexp(&ps,pRVar5);
  sVar12 = 0;
  pRVar5 = (Regexp *)0x0;
  goto LAB_001b3c86;
LAB_001b4300:
  local_b0 = (Regexp *)0x0;
  goto LAB_001b4309;
}

Assistant:

Regexp* Regexp::Parse(const StringPiece& s, ParseFlags global_flags,
                      RegexpStatus* status) {
  // Make status non-NULL (easier on everyone else).
  RegexpStatus xstatus;
  if (status == NULL)
    status = &xstatus;

  ParseState ps(global_flags, s, status);
  StringPiece t = s;

  // Convert regexp to UTF-8 (easier on the rest of the parser).
  if (global_flags & Latin1) {
    std::string* tmp = new std::string;
    ConvertLatin1ToUTF8(t, tmp);
    status->set_tmp(tmp);
    t = *tmp;
  }

  if (global_flags & Literal) {
    // Special parse loop for literal string.
    while (t.size() > 0) {
      Rune r;
      if (StringPieceToRune(&r, &t, status) < 0)
        return NULL;
      if (!ps.PushLiteral(r))
        return NULL;
    }
    return ps.DoFinish();
  }

  StringPiece lastunary = StringPiece();
  while (t.size() > 0) {
    StringPiece isunary = StringPiece();
    switch (t[0]) {
      default: {
        Rune r;
        if (StringPieceToRune(&r, &t, status) < 0)
          return NULL;
        if (!ps.PushLiteral(r))
          return NULL;
        break;
      }

      case '(':
        // "(?" introduces Perl escape.
        if ((ps.flags() & PerlX) && (t.size() >= 2 && t[1] == '?')) {
          // Flag changes and non-capturing groups.
          if (!ps.ParsePerlFlags(&t))
            return NULL;
          break;
        }
        if (ps.flags() & NeverCapture) {
          if (!ps.DoLeftParenNoCapture())
            return NULL;
        } else {
          if (!ps.DoLeftParen(StringPiece()))
            return NULL;
        }
        t.remove_prefix(1);  // '('
        break;

      case '|':
        if (!ps.DoVerticalBar())
          return NULL;
        t.remove_prefix(1);  // '|'
        break;

      case ')':
        if (!ps.DoRightParen())
          return NULL;
        t.remove_prefix(1);  // ')'
        break;

      case '^':  // Beginning of line.
        if (!ps.PushCarat())
          return NULL;
        t.remove_prefix(1);  // '^'
        break;

      case '$':  // End of line.
        if (!ps.PushDollar())
          return NULL;
        t.remove_prefix(1);  // '$'
        break;

      case '.':  // Any character (possibly except newline).
        if (!ps.PushDot())
          return NULL;
        t.remove_prefix(1);  // '.'
        break;

      case '[': {  // Character class.
        Regexp* re;
        if (!ps.ParseCharClass(&t, &re, status))
          return NULL;
        if (!ps.PushRegexp(re))
          return NULL;
        break;
      }

      case '*': {  // Zero or more.
        RegexpOp op;
        op = kRegexpStar;
        goto Rep;
      case '+':  // One or more.
        op = kRegexpPlus;
        goto Rep;
      case '?':  // Zero or one.
        op = kRegexpQuest;
        goto Rep;
      Rep:
        StringPiece opstr = t;
        bool nongreedy = false;
        t.remove_prefix(1);  // '*' or '+' or '?'
        if (ps.flags() & PerlX) {
          if (t.size() > 0 && t[0] == '?') {
            nongreedy = true;
            t.remove_prefix(1);  // '?'
          }
          if (lastunary.size() > 0) {
            // In Perl it is not allowed to stack repetition operators:
            //   a** is a syntax error, not a double-star.
            // (and a++ means something else entirely, which we don't support!)
            status->set_code(kRegexpRepeatOp);
            status->set_error_arg(StringPiece(
                lastunary.data(),
                static_cast<size_t>(t.data() - lastunary.data())));
            return NULL;
          }
        }
        opstr = StringPiece(opstr.data(),
                            static_cast<size_t>(t.data() - opstr.data()));
        if (!ps.PushRepeatOp(op, opstr, nongreedy))
          return NULL;
        isunary = opstr;
        break;
      }

      case '{': {  // Counted repetition.
        int lo, hi;
        StringPiece opstr = t;
        if (!MaybeParseRepetition(&t, &lo, &hi)) {
          // Treat like a literal.
          if (!ps.PushLiteral('{'))
            return NULL;
          t.remove_prefix(1);  // '{'
          break;
        }
        bool nongreedy = false;
        if (ps.flags() & PerlX) {
          if (t.size() > 0 && t[0] == '?') {
            nongreedy = true;
            t.remove_prefix(1);  // '?'
          }
          if (lastunary.size() > 0) {
            // Not allowed to stack repetition operators.
            status->set_code(kRegexpRepeatOp);
            status->set_error_arg(StringPiece(
                lastunary.data(),
                static_cast<size_t>(t.data() - lastunary.data())));
            return NULL;
          }
        }
        opstr = StringPiece(opstr.data(),
                            static_cast<size_t>(t.data() - opstr.data()));
        if (!ps.PushRepetition(lo, hi, opstr, nongreedy))
          return NULL;
        isunary = opstr;
        break;
      }

      case '\\': {  // Escaped character or Perl sequence.
        // \b and \B: word boundary or not
        if ((ps.flags() & Regexp::PerlB) &&
            t.size() >= 2 && (t[1] == 'b' || t[1] == 'B')) {
          if (!ps.PushWordBoundary(t[1] == 'b'))
            return NULL;
          t.remove_prefix(2);  // '\\', 'b'
          break;
        }

        if ((ps.flags() & Regexp::PerlX) && t.size() >= 2) {
          if (t[1] == 'A') {
            if (!ps.PushSimpleOp(kRegexpBeginText))
              return NULL;
            t.remove_prefix(2);  // '\\', 'A'
            break;
          }
          if (t[1] == 'z') {
            if (!ps.PushSimpleOp(kRegexpEndText))
              return NULL;
            t.remove_prefix(2);  // '\\', 'z'
            break;
          }
          // Do not recognize \Z, because this library can't
          // implement the exact Perl/PCRE semantics.
          // (This library treats "(?-m)$" as \z, even though
          // in Perl and PCRE it is equivalent to \Z.)

          if (t[1] == 'C') {  // \C: any byte [sic]
            if (!ps.PushSimpleOp(kRegexpAnyByte))
              return NULL;
            t.remove_prefix(2);  // '\\', 'C'
            break;
          }

          if (t[1] == 'Q') {  // \Q ... \E: the ... is always literals
            t.remove_prefix(2);  // '\\', 'Q'
            while (t.size() > 0) {
              if (t.size() >= 2 && t[0] == '\\' && t[1] == 'E') {
                t.remove_prefix(2);  // '\\', 'E'
                break;
              }
              Rune r;
              if (StringPieceToRune(&r, &t, status) < 0)
                return NULL;
              if (!ps.PushLiteral(r))
                return NULL;
            }
            break;
          }
        }

        if (t.size() >= 2 && (t[1] == 'p' || t[1] == 'P')) {
          Regexp* re = new Regexp(kRegexpCharClass, ps.flags() & ~FoldCase);
          re->ccb_ = new CharClassBuilder;
          switch (ParseUnicodeGroup(&t, ps.flags(), re->ccb_, status)) {
            case kParseOk:
              if (!ps.PushRegexp(re))
                return NULL;
              goto Break2;
            case kParseError:
              re->Decref();
              return NULL;
            case kParseNothing:
              re->Decref();
              break;
          }
        }

        const UGroup *g = MaybeParsePerlCCEscape(&t, ps.flags());
        if (g != NULL) {
          Regexp* re = new Regexp(kRegexpCharClass, ps.flags() & ~FoldCase);
          re->ccb_ = new CharClassBuilder;
          AddUGroup(re->ccb_, g, g->sign, ps.flags());
          if (!ps.PushRegexp(re))
            return NULL;
          break;
        }

        Rune r;
        if (!ParseEscape(&t, &r, status, ps.rune_max()))
          return NULL;
        if (!ps.PushLiteral(r))
          return NULL;
        break;
      }
    }
  Break2:
    lastunary = isunary;
  }
  return ps.DoFinish();
}